

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O1

_Bool tableSet(Table *table,ObjString *key,Value value)

{
  Entry *pEVar1;
  Table *pTVar2;
  uint uVar3;
  Entry *pEVar4;
  ObjString *pOVar5;
  bool bVar6;
  ObjString **ppOVar7;
  int iVar8;
  Entry *pEVar9;
  Entry *pEVar10;
  Entry *pEVar11;
  long lVar12;
  ulong uVar13;
  undefined1 *puVar14;
  Table *pTVar15;
  Table *pTVar16;
  uint uVar17;
  uint uVar18;
  Table *unaff_R14;
  Entry *pEVar19;
  Entry *pEVar20;
  
  iVar8 = table->capacity + 1;
  if ((double)iVar8 * 0.75 < (double)(table->count + 1)) {
    uVar13 = 7;
    if (6 < table->capacity) {
      uVar13 = (ulong)(iVar8 * 2 - 1);
    }
    pEVar9 = (Entry *)reallocate((void *)0x0,0,uVar13 * 0x10 + 0x10);
    uVar18 = (uint)uVar13;
    if (-1 < (int)uVar18) {
      lVar12 = 0;
      do {
        *(undefined8 *)((long)&pEVar9->key + lVar12) = 0;
        *(undefined8 *)((long)&pEVar9->value + lVar12) = 0x7ffc000000000001;
        lVar12 = lVar12 + 0x10;
      } while (uVar13 * 0x10 + 0x10 != lVar12);
    }
    table->count = 0;
    uVar3 = table->capacity;
    pEVar10 = (Entry *)(ulong)uVar3;
    if (-1 < (int)uVar3) {
      pEVar4 = table->entries;
      ppOVar7 = &pEVar10->key;
      puVar14 = (undefined1 *)0x0;
      do {
        pOVar5 = pEVar4[(long)puVar14].key;
        if (pOVar5 != (ObjString *)0x0) {
          uVar17 = pOVar5->hash & uVar18;
          pEVar19 = (Entry *)0x0;
          pEVar11 = pEVar10;
          do {
            pEVar1 = pEVar9 + uVar17;
            if (pEVar9[uVar17].key == (ObjString *)0x0) {
              pEVar10 = pEVar19;
              if (pEVar19 == (Entry *)0x0) {
                pEVar10 = pEVar1;
              }
              pEVar20 = pEVar10;
              if (pEVar1->value != 0x7ffc000000000001) goto LAB_00106a90;
              bVar6 = false;
            }
            else {
              pEVar20 = pEVar19;
              if (pEVar9[uVar17].key == pOVar5) {
                bVar6 = false;
                pEVar10 = pEVar1;
              }
              else {
LAB_00106a90:
                uVar17 = uVar17 + 1 & uVar18;
                bVar6 = true;
                pEVar10 = pEVar11;
                pEVar19 = pEVar20;
              }
            }
            pEVar11 = pEVar10;
          } while (bVar6);
          pEVar10->key = pOVar5;
          pEVar10->value = pEVar4[(long)puVar14].value;
          table->count = table->count + 1;
          unaff_R14 = table;
        }
        puVar14 = puVar14 + 1;
      } while (puVar14 != (undefined1 *)((long)ppOVar7 + 1));
    }
    reallocate(table->entries,(long)(int)uVar3 * 0x10 + 0x10,0);
    table->entries = pEVar9;
    table->capacity = uVar18;
  }
  uVar18 = key->hash & table->capacity;
  pTVar15 = (Table *)0x0;
  do {
    pTVar2 = (Table *)(table->entries + uVar18);
    pOVar5 = table->entries[uVar18].key;
    if (pOVar5 == (ObjString *)0x0) {
      pTVar16 = pTVar15;
      if (pTVar15 == (Table *)0x0) {
        pTVar16 = pTVar2;
      }
      if (pTVar2->entries != (Entry *)0x7ffc000000000001) goto LAB_00106b29;
      bVar6 = false;
    }
    else {
      pTVar16 = pTVar15;
      if (pOVar5 == key) {
        bVar6 = false;
        pTVar16 = pTVar2;
      }
      else {
LAB_00106b29:
        uVar18 = uVar18 + 1 & table->capacity;
        bVar6 = true;
        pTVar15 = pTVar16;
        pTVar16 = unaff_R14;
      }
    }
    unaff_R14 = pTVar16;
    if (!bVar6) {
      lVar12._0_4_ = pTVar16->count;
      lVar12._4_4_ = pTVar16->capacity;
      if ((lVar12 == 0) && (pTVar16->entries == (Entry *)0x7ffc000000000001)) {
        table->count = table->count + 1;
      }
      *(ObjString **)pTVar16 = key;
      pTVar16->entries = (Entry *)value;
      return lVar12 == 0;
    }
  } while( true );
}

Assistant:

bool tableSet(Table *table, ObjString *key, Value value) {
    //grow when the array becomes at least 75% full.
    if (table->count + 1 > (table->capacity + 1) * TABLE_MAX_LOAD) {
        int capacity = GROW_CAPACITY(table->capacity + 1) - 1;
        adjustCapacity(table, capacity);
    }

    Entry *entry = findEntry(table->entries, table->capacity, key);
    bool isNewKey = entry->key == NULL;

    //The count is no longer the number of entries in the hash table,
    // it’s the number of entries plus tombstones
    if (isNewKey && IS_NIL(entry->value)) table->count++;

    entry->key = key;
    entry->value = value;
    return isNewKey;
}